

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_instructions.cpp
# Opt level: O1

ir_constant *
anon_unknown.dwarf_58445::lower_instructions_visitor::_imm_fp
          (void *mem_ctx,glsl_type *type,double f,uint vector_elements)

{
  char cVar1;
  float16_t f16;
  ir_constant *this;
  
  cVar1 = type->field_0x4;
  if (cVar1 == '\x04') {
    this = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
    ir_constant::ir_constant(this,f,1);
  }
  else if (cVar1 == '\x03') {
    this = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
    f16.bits = _mesa_float_to_half((float)f);
    ir_constant::ir_constant(this,f16,1);
  }
  else {
    if (cVar1 != '\x02') {
      __assert_fail("!\"unknown float type for immediate\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_instructions.cpp"
                    ,0x604,
                    "static ir_constant *(anonymous namespace)::lower_instructions_visitor::_imm_fp(void *, const glsl_type *, double, unsigned int)"
                   );
    }
    this = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
    ir_constant::ir_constant(this,(float)f,1);
  }
  return this;
}

Assistant:

ir_constant *
lower_instructions_visitor::_imm_fp(void *mem_ctx,
                                    const glsl_type *type,
                                    double f,
                                    unsigned vector_elements)
{
   switch (type->base_type) {
   case GLSL_TYPE_FLOAT:
      return new(mem_ctx) ir_constant((float) f, vector_elements);
   case GLSL_TYPE_DOUBLE:
      return new(mem_ctx) ir_constant((double) f, vector_elements);
   case GLSL_TYPE_FLOAT16:
      return new(mem_ctx) ir_constant(float16_t(f), vector_elements);
   default:
      assert(!"unknown float type for immediate");
      return NULL;
   }
}